

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddrParser.cpp
# Opt level: O2

bool __thiscall axl::io::SockAddrParser::parse(SockAddrParser *this,in6_addr *addr)

{
  void *__src;
  bool bVar1;
  bool bVar2;
  size_t j;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint_t word;
  uchar_t ip4 [4];
  uint_t octet;
  
  tryChar(this,':');
  uVar4 = 0xffffffffffffffff;
  uVar5 = 0;
  uVar6 = 8;
  while( true ) {
    if (uVar5 == 8) {
      if (uVar4 == 0xffffffffffffffff) {
        return true;
      }
      goto LAB_00135c69;
    }
    bVar1 = tryChar(this,':');
    if (bVar1) {
      uVar4 = uVar5;
    }
    bVar1 = parseInt(this,&word,0x10);
    if (!bVar1) {
      return false;
    }
    bVar1 = tryChar(this,':');
    if ((!bVar1) && (bVar2 = tryChar(this,'.'), bVar2)) break;
    (addr->__in6_u).__u6_addr16[uVar5] = (ushort)word << 8 | (ushort)word >> 8;
    uVar5 = uVar5 + 1;
    if (!bVar1) goto LAB_00135c33;
  }
  if (uVar5 == 7) {
    err::ErrorRef::ErrorRef((ErrorRef *)&octet,0x16);
    err::setError((ErrorRef *)&octet);
    goto LAB_00135cbf;
  }
  ip4[0] = ((byte)(word >> 8) & 0xf) * 'd' + ((byte)(word >> 4) & 0xf) * '\n' + ((byte)word & 0xf);
  lVar3 = 1;
  while( true ) {
    bVar1 = parseInt(this,&octet,10);
    if (!bVar1) {
      return false;
    }
    ip4[lVar3] = (uchar_t)octet;
    if (lVar3 == 3) break;
    bVar1 = expectChar(this,'.');
    lVar3 = lVar3 + 1;
    if (!bVar1) {
      return false;
    }
  }
  *(uchar_t (*) [4])((long)&addr->__in6_u + uVar5 * 2) = ip4;
  uVar5 = uVar5 + 2;
LAB_00135c33:
  uVar6 = uVar5;
  if (uVar4 != 0xffffffffffffffff) {
LAB_00135c69:
    if (uVar4 <= uVar6 && uVar6 - uVar4 != 0) {
      __src = (void *)((long)&addr->__in6_u + uVar4 * 2);
      memmove((void *)((long)__src + (8 - uVar6) * 2),__src,(uVar6 - uVar4) * 2);
      memset(__src,0,(8 - uVar6) * 2);
      return true;
    }
    return true;
  }
  if (uVar5 == 8) {
    return true;
  }
  err::ErrorRef::ErrorRef((ErrorRef *)&octet,0x16);
  err::setError((ErrorRef *)&octet);
LAB_00135cbf:
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef
            ((BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)&octet);
  return false;
}

Assistant:

bool
SockAddrParser::parse(in6_addr* addr) {
	bool result;

	uint16_t* ip = (uint16_t*)addr;

	size_t zeroRunIdx = -1;
	bool isIp4 = false;
	uchar_t ip4[4];

	tryChar(':');

	size_t i = 0;
	while (i < 8) {
		result = tryChar(':');
		if (result)
			zeroRunIdx = i;

		uint_t word;
		result = parseInt(&word, 16);
		if (!result)
			return false;

		result = tryChar(':');
		if (!result) {
			result = tryChar('.');
			if (result) {
				if (i > 6) {
					err::setError(err::SystemErrorCode_InvalidAddress);
					return false;
				}

				ip4[0] = (uchar_t)
					((word & 0x0f) +
					((word & 0xf0) >> 4) * 10 +
					((word & 0xf00) >> 8) * 100);

				isIp4 = true;
				break;
			}
		}

		ip[i] = sl::swapByteOrder16((uint16_t)word);
		i++;

		if (!result)
			break;
	}

	if (isIp4) {
		for (size_t j = 1;; j++) {
			uint_t octet;
			result = parseInt(&octet, 10);
			if (!result)
				return false;

			ip4[j] = (uchar_t)octet;

			if (j >= 3)
				break;

			result = expectChar('.');
			if (!result)
				return false;
		}

		ASSERT(i <= 6);
		ip[i] = ip4[0] + (ip4[1] << 8);
		ip[i + 1] = ip4[2] + (ip4[3] << 8);
		i += 2;
	}

	if (zeroRunIdx != -1) {
		ASSERT(i <= 8 && zeroRunIdx <= i);

		size_t zeroRunLength = 8 - i;

		if (zeroRunIdx < i) {
			memmove(&ip[zeroRunIdx + zeroRunLength], &ip[zeroRunIdx], (i - zeroRunIdx) * sizeof(uint16_t));
			memset(&ip[zeroRunIdx], 0, zeroRunLength * sizeof(uint16_t));
		}
	} else if (i != 8) {
		err::setError(err::SystemErrorCode_InvalidAddress);
		return false;
	}

	return true;
}